

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

UCVarValue FBaseCVar::FromFloat(float value,ECVarType type)

{
  ECVarType type_local;
  float value_local;
  UCVarValue ret;
  
  switch(type) {
  case CVAR_Bool:
    _type_local = (char *)CONCAT71(stack0xfffffffffffffff1,value != 0.0);
    break;
  case CVAR_Int:
    _type_local = (char *)CONCAT44(value_local,(int)value);
    break;
  case CVAR_Float:
    _type_local = (char *)CONCAT44(value_local,value);
    break;
  case CVAR_String:
    mysnprintf(cstrbuf,0x28,"%H",(double)value);
    _type_local = cstrbuf;
    break;
  default:
    break;
  case CVAR_GUID:
    _type_local = (char *)0x0;
  }
  return (UCVarValue)_type_local;
}

Assistant:

UCVarValue FBaseCVar::FromFloat (float value, ECVarType type)
{
	UCVarValue ret;

	switch (type)
	{
	case CVAR_Bool:
		ret.Bool = value != 0.f;
		break;

	case CVAR_Int:
		ret.Int = (int)value;
		break;

	case CVAR_Float:
		ret.Float = value;
		break;

	case CVAR_String:
		IGNORE_FORMAT_PRE
		mysnprintf (cstrbuf, countof(cstrbuf), "%H", value);
		IGNORE_FORMAT_POST
		ret.String = cstrbuf;
		break;

	case CVAR_GUID:
		ret.pGUID = NULL;
		break;

	default:
		break;
	}

	return ret;
}